

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry_sparse.c
# Opt level: O3

wchar_t archive_entry_sparse_count(archive_entry *entry)

{
  ae_sparse **ppaVar1;
  long lVar2;
  ae_sparse *paVar3;
  ae_sparse *paVar4;
  la_int64_t lVar5;
  wchar_t wVar6;
  
  ppaVar1 = &entry->sparse_head;
  wVar6 = L'\xffffffff';
  paVar4 = (ae_sparse *)ppaVar1;
  do {
    paVar4 = paVar4->next;
    wVar6 = wVar6 + L'\x01';
  } while (paVar4 != (ae_sparse *)0x0);
  if (wVar6 == L'\x01') {
    wVar6 = L'\x01';
    if (((*ppaVar1)->offset == 0) &&
       (lVar2 = (*ppaVar1)->length, lVar5 = archive_entry_size(entry), lVar5 <= lVar2)) {
      paVar4 = *ppaVar1;
      while (paVar4 != (ae_sparse *)0x0) {
        paVar3 = paVar4->next;
        free(paVar4);
        *ppaVar1 = paVar3;
        paVar4 = paVar3;
      }
      entry->sparse_tail = (ae_sparse *)0x0;
      wVar6 = L'\0';
    }
  }
  return wVar6;
}

Assistant:

int
archive_entry_sparse_count(struct archive_entry *entry)
{
	struct ae_sparse *sp;
	int count = 0;

	for (sp = entry->sparse_head; sp != NULL; sp = sp->next)
		count++;

	/*
	 * Sanity check if this entry is exactly sparse.
	 * If amount of sparse blocks is just one and it indicates the whole
	 * file data, we should remove it and return zero.
	 */
	if (count == 1) {
		sp = entry->sparse_head;
		if (sp->offset == 0 &&
		    sp->length >= archive_entry_size(entry)) {
			count = 0;
			archive_entry_sparse_clear(entry);
		}
	}

	return (count);
}